

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<float,_sptk::int24_t>::Run
          (DataTransform<float,_sptk::int24_t> *this,istream *input_stream)

{
  NumericType NVar1;
  WarningType WVar2;
  float fVar3;
  int24_t *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int24_t *piVar8;
  ostream *poVar9;
  uint8_t *puVar10;
  size_t *__idx;
  uint8_t *puVar11;
  uint8_t uVar12;
  uint uVar13;
  uint8_t uVar14;
  long lVar15;
  bool bVar16;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float fVar17;
  float input_data;
  int24_t local_2b7;
  int24_t local_2b4;
  allocator local_2b1;
  int24_t *local_2b0;
  int24_t *local_2a8;
  uint8_t *local_2a0;
  uint8_t *local_298;
  uint8_t *local_290;
  uint8_t *local_288;
  ulong local_280;
  int local_278;
  int local_274;
  istream *local_270;
  string *local_268;
  longdouble local_25c;
  string local_250;
  string word;
  char buffer [128];
  
  local_2a8 = &this->minimum_value_;
  local_2b0 = &this->maximum_value_;
  local_298 = (this->maximum_value_).value + 1;
  local_2a0 = (this->maximum_value_).value + 2;
  local_288 = (this->minimum_value_).value + 1;
  local_290 = (this->minimum_value_).value + 2;
  local_268 = &this->print_format_;
  uVar7 = 0;
  local_270 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar16 = word._M_string_length == 0;
      if (!bVar16) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (float)in_ST0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar16) goto LAB_0012f435;
      if (bVar16) {
        if (bVar16) {
LAB_0012f79e:
          bVar16 = true;
          if ((this->is_ascii_output_ == true) && ((int)uVar7 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_0012f7c0:
          bVar16 = false;
        }
        return bVar16;
      }
    }
    else {
      bVar16 = sptk::ReadStream<float>(&input_data,input_stream);
      if (!bVar16) goto LAB_0012f79e;
LAB_0012f435:
      fVar3 = input_data;
      local_280 = uVar7;
      iVar5 = sptk::int24_t::operator_cast_to_int(local_2a8);
      iVar6 = sptk::int24_t::operator_cast_to_int(local_2b0);
      piVar8 = local_2a8;
      if (iVar5 < iVar6) {
        NVar1 = this->input_numeric_type_;
        if (NVar1 == kFloatingPoint) {
          local_25c = (longdouble)input_data;
          local_274 = sptk::int24_t::operator_cast_to_int(local_2a8);
          piVar4 = local_2b0;
          puVar10 = local_288;
          puVar11 = local_290;
          in_ST6 = in_ST5;
          in_ST7 = in_ST5;
          if ((local_25c < (longdouble)local_274) ||
             (local_278 = sptk::int24_t::operator_cast_to_int(local_2b0), piVar8 = piVar4,
             puVar10 = local_298, puVar11 = local_2a0, in_ST6 = in_ST5, in_ST7 = in_ST5,
             (float)local_278 < input_data)) goto LAB_0012f5e2;
          goto LAB_0012f671;
        }
        if (NVar1 == kUnsignedInteger) {
          uVar7 = (ulong)input_data;
          fVar17 = input_data - 9.223372e+18;
          iVar5 = sptk::int24_t::operator_cast_to_int(local_2a8);
          piVar4 = local_2b0;
          puVar10 = local_288;
          puVar11 = local_290;
          if ((((long)fVar17 & (long)uVar7 >> 0x3f | uVar7) < (ulong)(long)iVar5) ||
             (iVar5 = sptk::int24_t::operator_cast_to_int(local_2b0), piVar8 = piVar4,
             puVar10 = local_298, puVar11 = local_2a0,
             (ulong)(long)iVar5 <
             (ulong)((long)(input_data - 9.223372e+18) & (long)input_data >> 0x3f | (long)input_data
                    ))) goto LAB_0012f5e2;
          goto LAB_0012f671;
        }
        if ((NVar1 != kSignedInteger) ||
           ((lVar15 = (long)input_data, iVar5 = sptk::int24_t::operator_cast_to_int(local_2a8),
            piVar4 = local_2b0, puVar10 = local_288, puVar11 = local_290, iVar5 <= lVar15 &&
            (iVar5 = sptk::int24_t::operator_cast_to_int(local_2b0), piVar8 = piVar4,
            puVar10 = local_298, puVar11 = local_2a0, (long)input_data <= (long)iVar5))))
        goto LAB_0012f671;
LAB_0012f5e2:
        uVar14 = *puVar11;
        uVar12 = *puVar10;
        uVar13 = (uint)piVar8->value[0];
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar9 = (ostream *)std::ostream::operator<<((ostream *)&word,(int)local_280);
          std::operator<<(poVar9,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_2b1);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar2 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          input_stream = local_270;
          if (WVar2 == kExit) goto LAB_0012f7c0;
        }
      }
      else {
LAB_0012f671:
        if (this->rounding_ == true) {
          if (input_data <= 0.0) {
            fVar3 = input_data + -0.5;
          }
          else {
            fVar3 = input_data + 0.5;
          }
        }
        uVar13 = (uint)fVar3;
        uVar12 = (uint8_t)(uVar13 >> 8);
        uVar14 = (uint8_t)(uVar13 >> 0x10);
      }
      if (this->is_ascii_output_ == true) {
        local_2b4.value[0] = (uint8_t)uVar13;
        local_2b4.value[1] = uVar12;
        local_2b4.value[2] = uVar14;
        bVar16 = sptk::SnPrintf<sptk::int24_t>(&local_2b4,local_268,0x80,buffer);
        if (!bVar16) goto LAB_0012f7c0;
        std::operator<<((ostream *)&std::cout,buffer);
        if (((int)local_280 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          uVar7 = local_280;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          uVar7 = local_280;
        }
      }
      else {
        local_2b7.value[0] = (uint8_t)uVar13;
        local_2b7.value[1] = uVar12;
        local_2b7.value[2] = uVar14;
        bVar16 = sptk::WriteStream<sptk::int24_t>(&local_2b7,(ostream *)&std::cout);
        uVar7 = local_280;
        if (!bVar16) goto LAB_0012f7c0;
      }
    }
    uVar7 = (ulong)((int)uVar7 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }